

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O0

_Bool do_vfp_3op_dp(DisasContext_conflict1 *s,VFPGen3OpDPFn_conflict *fn,int vd,int vn,int vm,
                   _Bool reads_vd)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  TCGv_i64 var;
  TCGv_i64 var_00;
  TCGv_i64 var_01;
  TCGv_ptr arg;
  TCGv_ptr fpst;
  TCGv_i64 fd;
  TCGv_i64 f1;
  TCGv_i64 f0;
  int local_40;
  int veclen;
  uint32_t delta_d;
  uint32_t delta_m;
  TCGContext_conflict1 *tcg_ctx;
  int iStack_28;
  _Bool reads_vd_local;
  int vm_local;
  int vn_local;
  int vd_local;
  VFPGen3OpDPFn_conflict *fn_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  veclen = 0;
  local_40 = 0;
  f0._4_4_ = s->vec_len;
  _Var1 = isar_feature_aa32_fpdp_v2(s->isar);
  if (_Var1) {
    _Var1 = isar_feature_aa32_simd_r32(s->isar);
    if ((_Var1) || (((vd | vn | vm) & 0x10U) == 0)) {
      _Var1 = isar_feature_aa32_fpshvec(s->isar);
      if ((_Var1) || ((f0._4_4_ == 0 && (s->vec_stride == 0)))) {
        _Var1 = vfp_access_check(s);
        if (_Var1) {
          if (0 < f0._4_4_) {
            _Var1 = vfp_dreg_is_scalar(vd);
            if (_Var1) {
              f0._4_4_ = 0;
            }
            else {
              local_40 = (s->vec_stride >> 1) + 1;
              _Var1 = vfp_dreg_is_scalar(vm);
              veclen = local_40;
              if (_Var1) {
                veclen = 0;
              }
            }
          }
          var = tcg_temp_new_i64(tcg_ctx_00);
          var_00 = tcg_temp_new_i64(tcg_ctx_00);
          var_01 = tcg_temp_new_i64(tcg_ctx_00);
          arg = get_fpstatus_ptr_aarch64(tcg_ctx_00,0);
          neon_load_reg64(tcg_ctx_00,var,vn);
          neon_load_reg64(tcg_ctx_00,var_00,vm);
          tcg_ctx._4_4_ = vm;
          iStack_28 = vn;
          vm_local = vd;
          while( true ) {
            if (reads_vd) {
              neon_load_reg64(tcg_ctx_00,var_01,vm_local);
            }
            (*fn)(tcg_ctx_00,var_01,var,var_00,arg);
            neon_store_reg64(tcg_ctx_00,var_01,vm_local);
            if (f0._4_4_ == 0) break;
            f0._4_4_ = f0._4_4_ + -1;
            vm_local = vfp_advance_dreg(vm_local,local_40);
            iStack_28 = vfp_advance_dreg(iStack_28,local_40);
            neon_load_reg64(tcg_ctx_00,var,iStack_28);
            if (veclen != 0) {
              tcg_ctx._4_4_ = vfp_advance_dreg(tcg_ctx._4_4_,veclen);
              neon_load_reg64(tcg_ctx_00,var_00,tcg_ctx._4_4_);
            }
          }
          tcg_temp_free_i64(tcg_ctx_00,var);
          tcg_temp_free_i64(tcg_ctx_00,var_00);
          tcg_temp_free_i64(tcg_ctx_00,var_01);
          tcg_temp_free_ptr(tcg_ctx_00,arg);
          s_local._7_1_ = true;
        }
        else {
          s_local._7_1_ = true;
        }
      }
      else {
        s_local._7_1_ = false;
      }
    }
    else {
      s_local._7_1_ = false;
    }
  }
  else {
    s_local._7_1_ = false;
  }
  return s_local._7_1_;
}

Assistant:

static bool do_vfp_3op_dp(DisasContext *s, VFPGen3OpDPFn *fn,
                          int vd, int vn, int vm, bool reads_vd)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    uint32_t delta_m = 0;
    uint32_t delta_d = 0;
    int veclen = s->vec_len;
    TCGv_i64 f0, f1, fd;
    TCGv_ptr fpst;

    if (!dc_isar_feature(aa32_fpdp_v2, s)) {
        return false;
    }

    /* UNDEF accesses to D16-D31 if they don't exist */
    if (!dc_isar_feature(aa32_simd_r32, s) && ((vd | vn | vm) & 0x10)) {
        return false;
    }

    if (!dc_isar_feature(aa32_fpshvec, s) &&
        (veclen != 0 || s->vec_stride != 0)) {
        return false;
    }

    if (!vfp_access_check(s)) {
        return true;
    }

    if (veclen > 0) {
        /* Figure out what type of vector operation this is.  */
        if (vfp_dreg_is_scalar(vd)) {
            /* scalar */
            veclen = 0;
        } else {
            delta_d = (s->vec_stride >> 1) + 1;

            if (vfp_dreg_is_scalar(vm)) {
                /* mixed scalar/vector */
                delta_m = 0;
            } else {
                /* vector */
                delta_m = delta_d;
            }
        }
    }

    f0 = tcg_temp_new_i64(tcg_ctx);
    f1 = tcg_temp_new_i64(tcg_ctx);
    fd = tcg_temp_new_i64(tcg_ctx);
    fpst = get_fpstatus_ptr(tcg_ctx, 0);

    neon_load_reg64(tcg_ctx, f0, vn);
    neon_load_reg64(tcg_ctx, f1, vm);

    for (;;) {
        if (reads_vd) {
            neon_load_reg64(tcg_ctx, fd, vd);
        }
        fn(tcg_ctx, fd, f0, f1, fpst);
        neon_store_reg64(tcg_ctx, fd, vd);

        if (veclen == 0) {
            break;
        }
        /* Set up the operands for the next iteration */
        veclen--;
        vd = vfp_advance_dreg(vd, delta_d);
        vn = vfp_advance_dreg(vn, delta_d);
        neon_load_reg64(tcg_ctx, f0, vn);
        if (delta_m) {
            vm = vfp_advance_dreg(vm, delta_m);
            neon_load_reg64(tcg_ctx, f1, vm);
        }
    }

    tcg_temp_free_i64(tcg_ctx, f0);
    tcg_temp_free_i64(tcg_ctx, f1);
    tcg_temp_free_i64(tcg_ctx, fd);
    tcg_temp_free_ptr(tcg_ctx, fpst);

    return true;
}